

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O0

void __thiscall cmCTestCoverageHandler::LoadLabels(cmCTestCoverageHandler *this)

{
  cmCTest *this_00;
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  undefined1 local_400 [8];
  string line;
  ifstream finList;
  string local_1d8 [32];
  undefined1 local_1b8 [8];
  ostringstream cmCTestLog_msg;
  undefined1 local_30 [8];
  string fileList;
  cmCTestCoverageHandler *this_local;
  
  fileList.field_2._8_8_ = this;
  cmCTest::GetBinaryDir_abi_cxx11_((string *)local_30,(this->super_cmCTestGenericHandler).CTest);
  pcVar2 = cmake::GetCMakeFilesDirectory();
  std::__cxx11::string::operator+=((string *)local_30,pcVar2);
  std::__cxx11::string::operator+=((string *)local_30,"/TargetDirectories.txt");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
  poVar3 = std::operator<<((ostream *)local_1b8," target directory list [");
  poVar3 = std::operator<<(poVar3,(string *)local_30);
  std::operator<<(poVar3,"]\n");
  this_00 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::ostringstream::str();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(this_00,4,
               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
               ,0x896,pcVar2,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream((void *)((long)&line.field_2 + 8),pcVar2,_S_in);
  std::__cxx11::string::string((string *)local_400);
  while( true ) {
    bVar1 = cmsys::SystemTools::GetLineFromStream
                      ((istream *)(line.field_2._M_local_buf + 8),(string *)local_400,(bool *)0x0,-1
                      );
    if (!bVar1) break;
    pcVar2 = (char *)std::__cxx11::string::c_str();
    LoadLabels(this,pcVar2);
  }
  std::__cxx11::string::~string((string *)local_400);
  std::ifstream::~ifstream((void *)((long)&line.field_2 + 8));
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void cmCTestCoverageHandler::LoadLabels()
{
  std::string fileList = this->CTest->GetBinaryDir();
  fileList += cmake::GetCMakeFilesDirectory();
  fileList += "/TargetDirectories.txt";
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     " target directory list [" << fileList << "]\n",
                     this->Quiet);
  cmsys::ifstream finList(fileList.c_str());
  std::string line;
  while (cmSystemTools::GetLineFromStream(finList, line)) {
    this->LoadLabels(line.c_str());
  }
}